

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::EntryLookupSetter(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  int in_stack_00000010;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  Var unused;
  Var setter;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  setter = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x5f4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b93325;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&setter,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)setter & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x5f7,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b93325:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar4 = JavascriptConversion::ToObject
                    (pvVar6,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
  if (BVar4 != 0) {
    if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
      pvVar6 = *(Var *)(*(long *)((long)args.super_Arguments.Values[1] + 8) + 0x430);
    }
    else {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    }
    JavascriptConversion::ToPropertyKey(pvVar6,pSVar1,&local_58,(PropertyString **)0x0);
    propertyRecord = (PropertyRecord *)0x0;
    unused = (Var)0x0;
    BVar4 = JavascriptOperators::GetAccessors
                      ((RecyclableObject *)args.super_Arguments.Values,local_58->pid,pSVar1,
                       &propertyRecord,&unused);
    if (BVar4 == 0 || unused == (Var)0x0) {
      unused = *(Var *)(*(long *)((long)args.super_Arguments.Values[1] + 8) + 0x430);
    }
    return unused;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Object.prototype.__lookupSetter__");
}

Assistant:

Var JavascriptObject::EntryLookupSetter(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* obj = nullptr;
    if (!JavascriptConversion::ToObject(args[0], scriptContext, &obj))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.__lookupSetter__"));
    }

    Var propertyKey = args.Info.Count > 1 ? args[1] : obj->GetLibrary()->GetUndefined();
    const PropertyRecord* propertyRecord;
    JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

    Var unused = nullptr;
    Var setter = nullptr;
    if (JavascriptOperators::GetAccessors(obj, propertyRecord->GetPropertyId(), scriptContext, &unused, &setter))
    {
        if (setter != nullptr)
        {
            return setter;
        }
    }

    return obj->GetLibrary()->GetUndefined();
}